

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void read_key(EVP_PKEY **key,char *filename)

{
  int iVar1;
  EVP_PKEY *pEVar2;
  FILE *local_20;
  FILE *file;
  char *filename_local;
  EVP_PKEY **key_local;
  
  file = (FILE *)filename;
  filename_local = (char *)key;
  iVar1 = fopen_s((FILE **)&local_20,filename,"r");
  if (iVar1 != 0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x151,"cannot open private key file %s",file);
    exit(0x5d);
  }
  pEVar2 = PEM_read_PrivateKey(local_20,(EVP_PKEY **)filename_local,(undefined1 *)0x0,(void *)0x0);
  if (pEVar2 == (EVP_PKEY *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
            ,0x155,"error while reading private key %s",file);
    ERR_print_errors_fp(_stderr);
    exit(0x5d);
  }
  fclose(local_20);
  return;
}

Assistant:

void read_key(EVP_PKEY** key, char* filename) {
    FILE *file;
    // Read private key file
    if (fopen_s(&file, filename, "r")) {
        log_error("cannot open private key file %s", filename);
        exit (SCEP_PKISTATUS_FILE);
    }
    if (!PEM_read_PrivateKey(file, key, NULL, NULL)) {
        log_error("error while reading private key %s", filename);
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_FILE);
    }
    fclose(file);
}